

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

bool __thiscall QTimerInfoList::hasPendingTimers(QTimerInfoList *this)

{
  long lVar1;
  
  if ((this->timers).d.size != 0) {
    lVar1 = std::chrono::_V2::steady_clock::now();
    (this->currentTime).__d.__r = lVar1;
    return lVar1 < ((*(this->timers).d.ptr)->timeout).__d.__r;
  }
  return false;
}

Assistant:

constexpr bool isEmpty() const noexcept { return size() == 0; }